

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O3

uint __thiscall CScript::GetSigOpCount(CScript *this,bool fAccurate)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  opcodetype oVar4;
  const_iterator end;
  CScript *pCVar5;
  uint uVar6;
  long in_FS_OFFSET;
  opcodetype opcode;
  const_iterator pc;
  opcodetype local_44;
  const_iterator local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = (this->super_CScriptBase)._size;
  local_40.ptr = (uchar *)(this->super_CScriptBase)._union.indirect_contents.indirect;
  uVar3 = uVar6 - 0x1d;
  if (uVar6 < 0x1d) {
    uVar3 = uVar6;
    local_40.ptr = (uchar *)this;
  }
  if ((int)uVar3 < 1) {
    uVar6 = 0;
  }
  else {
    end.ptr = (uchar *)((long)&(((CScript *)local_40.ptr)->super_CScriptBase)._union + (ulong)uVar3)
    ;
    uVar6 = 0;
    oVar4 = OP_INVALIDOPCODE;
    do {
      bVar2 = GetScriptOp(&local_40,end,&local_44,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
      if (!bVar2) break;
      if ((local_44 & 0xfffffffe) == OP_CHECKMULTISIG) {
        if (oVar4 - OP_1 < 0x10 && fAccurate) {
          uVar6 = (uVar6 + oVar4) - 0x50;
        }
        else {
          uVar6 = uVar6 + 0x14;
        }
      }
      else if ((local_44 & 0xfffffffe) == OP_CHECKSIG) {
        uVar6 = uVar6 + 1;
      }
      uVar3 = (this->super_CScriptBase)._size;
      uVar1 = uVar3 - 0x1d;
      if (uVar3 < 0x1d) {
        uVar1 = uVar3;
      }
      pCVar5 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
      if (uVar3 < 0x1d) {
        pCVar5 = this;
      }
      end.ptr = (uchar *)((long)&(pCVar5->super_CScriptBase)._union + (long)(int)uVar1);
      oVar4 = local_44;
    } while (local_40.ptr < end.ptr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar6;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int CScript::GetSigOpCount(bool fAccurate) const
{
    unsigned int n = 0;
    const_iterator pc = begin();
    opcodetype lastOpcode = OP_INVALIDOPCODE;
    while (pc < end())
    {
        opcodetype opcode;
        if (!GetOp(pc, opcode))
            break;
        if (opcode == OP_CHECKSIG || opcode == OP_CHECKSIGVERIFY)
            n++;
        else if (opcode == OP_CHECKMULTISIG || opcode == OP_CHECKMULTISIGVERIFY)
        {
            if (fAccurate && lastOpcode >= OP_1 && lastOpcode <= OP_16)
                n += DecodeOP_N(lastOpcode);
            else
                n += MAX_PUBKEYS_PER_MULTISIG;
        }
        lastOpcode = opcode;
    }
    return n;
}